

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O3

void __thiscall
DTextEnterMenu::DTextEnterMenu
          (DTextEnterMenu *this,DMenu *parent,char *textbuffer,int maxlen,int sizemode,bool showgrid
          ,bool allowcolors)

{
  uint uVar1;
  size_t sVar2;
  undefined4 uVar3;
  int iVar4;
  undefined3 in_register_00000089;
  
  DMenu::DMenu(&this->super_DMenu,parent);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00866010;
  this->mEnterString = textbuffer;
  this->mEnterSize = maxlen;
  sVar2 = strlen(textbuffer);
  uVar1 = (uint)sVar2;
  this->mEnterPos = uVar1;
  this->mSizeMode = sizemode;
  uVar3._0_1_ = true;
  uVar3._1_1_ = false;
  uVar3._2_2_ = 0;
  if (CONCAT31(in_register_00000089,showgrid) == 0) {
    uVar3 = m_showinputgrid._40_4_;
  }
  this->mInputGridOkay = SUB41(uVar3,0);
  iVar4 = 0xc;
  if (uVar1 == 0) {
    iVar4 = 0;
  }
  this->InputGridX = iVar4;
  this->InputGridY = (uint)(uVar1 != 0) << 2;
  this->AllowColors = allowcolors;
  return;
}

Assistant:

DTextEnterMenu::DTextEnterMenu(DMenu *parent, char *textbuffer, int maxlen, int sizemode, bool showgrid, bool allowcolors)
: DMenu(parent)
{
	mEnterString = textbuffer;
	mEnterSize = maxlen;
	mEnterPos = (unsigned)strlen(textbuffer);
	mSizeMode = sizemode;
	mInputGridOkay = showgrid || m_showinputgrid;
	if (mEnterPos > 0)
	{
		InputGridX = INPUTGRID_WIDTH - 1;
		InputGridY = INPUTGRID_HEIGHT - 1;
	}
	else
	{
		// If we are naming a new save, don't start the cursor on "end".
		InputGridX = 0;
		InputGridY = 0;
	}
	AllowColors = allowcolors; // [TP]
}